

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O3

void __thiscall
Nova::Example<float,_3>::Write_Substep(Example<float,_3> *this,string *title,int substep,int level)

{
  ostream *poVar1;
  long *plVar2;
  
  if (this->write_substeps_level < level) {
    return;
  }
  std::__cxx11::string::_M_assign((string *)&this->frame_title);
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Writing substep [",0x11);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->frame_title)._M_dataplus._M_p,
                      (this->frame_title)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]: output_number=",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->output_number + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", frame=",8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->current_frame);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", substep=",10);
  plVar2 = (long *)std::ostream::operator<<(poVar1,substep);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  this->output_number = this->output_number + 1;
  (*this->_vptr_Example[3])(this);
  std::__cxx11::string::_M_replace
            ((ulong)&this->frame_title,0,(char *)(this->frame_title)._M_string_length,0x130f07);
  return;
}

Assistant:

void Example<T,d>::
Write_Substep(const std::string& title,const int substep,const int level)
{
    if(level<=write_substeps_level)
    {
        frame_title=title;
        *output<<"Writing substep ["<<frame_title<<"]: output_number="<<output_number+1<<", frame="<<current_frame<<", substep="<<substep<<std::endl;
        Write_Output_Files(++output_number);frame_title="";
    }
}